

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  LogMessageFatal LStack_38;
  
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  if ((long)size <= (long)(this->buffer_end_ + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
  }
  iVar1 = BytesAvailable(this,ptr);
  while( true ) {
    iVar3 = size - iVar1;
    if (iVar3 == 0 || size < iVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,0x1ab,"size > chunk_size");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar2 = Next(this);
    if (pcVar2 == (char *)0x0) break;
    ptr = pcVar2 + 0x10;
    iVar1 = BytesAvailable(this,ptr);
    size = iVar3;
    if (iVar3 <= iVar1) {
      std::__cxx11::string::append((char *)str,(ulong)ptr);
      return ptr + iVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (ABSL_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}